

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

bool __thiscall anon_unknown.dwarf_f6f6::MovieState::prepare(MovieState *this)

{
  int iVar1;
  undefined8 uVar2;
  ostream *poVar3;
  thread *this_00;
  pointer pAVar4;
  pointer pAVar5;
  MovieState **__args;
  offset_in_MovieState_to_subr in_RDI;
  AVFormatContext *fmtctx;
  AVIOInterruptCB intcb;
  AVIOContext *avioctx;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter> *in_stack_ffffffffffffff90;
  _Mem_fn<int_((anonymous_namespace)::MovieState::*)()> *in_stack_ffffffffffffffc8;
  thread local_28;
  offset_in_MovieState_to_subr local_20;
  undefined8 local_18 [2];
  bool local_1;
  
  local_18[0] = 0;
  local_28._M_id._M_thread = (id)decode_interrupt_cb;
  local_20 = in_RDI;
  uVar2 = std::__cxx11::string::c_str();
  iVar1 = avio_open2(local_18,uVar2,1,&local_28,0);
  if (iVar1 == 0) {
    std::unique_ptr<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>::reset
              ((unique_ptr<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter> *)
               in_stack_ffffffffffffff90,(pointer)in_stack_ffffffffffffff88);
    this_00 = (thread *)avformat_alloc_context();
    pAVar4 = std::unique_ptr<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>::get
                       ((unique_ptr<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter> *)
                        in_stack_ffffffffffffff90);
    this_00[4]._M_id._M_thread = (native_handle_type)pAVar4;
    this_00[0x99]._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    this_00[0x9a]._M_id._M_thread = local_20;
    uVar2 = std::__cxx11::string::c_str();
    iVar1 = avformat_open_input(&stack0xffffffffffffffd0,uVar2,0);
    if (iVar1 == 0) {
      std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::reset
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      pAVar5 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::get
                         (in_stack_ffffffffffffff90);
      iVar1 = avformat_find_stream_info(pAVar5,0);
      if (iVar1 < 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,(string *)(in_RDI + 0x5a0));
        poVar3 = std::operator<<(poVar3,": failed to find stream info");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_1 = false;
      }
      else {
        pAVar5 = std::unique_ptr<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>::get
                           (in_stack_ffffffffffffff90);
        uVar2 = std::__cxx11::string::c_str();
        av_dump_format(pAVar5,0,uVar2);
        std::mem_fn<int(),(anonymous_namespace)::MovieState>(in_RDI);
        std::thread::
        thread<std::_Mem_fn<int((anonymous_namespace)::MovieState::*)()>,(anonymous_namespace)::MovieState*,void>
                  (this_00,in_stack_ffffffffffffffc8,__args);
        std::thread::operator=((thread *)pAVar5,(thread *)in_stack_ffffffffffffff88);
        std::thread::~thread((thread *)0x10e2a6);
        local_1 = true;
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
      poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x5a0));
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      local_1 = false;
    }
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to open ");
    poVar3 = std::operator<<(poVar3,(string *)(in_RDI + 0x5a0));
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MovieState::prepare()
{
    AVIOContext *avioctx{nullptr};
    AVIOInterruptCB intcb{decode_interrupt_cb, this};
    if(avio_open2(&avioctx, mFilename.c_str(), AVIO_FLAG_READ, &intcb, nullptr))
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mIOContext.reset(avioctx);

    /* Open movie file. If avformat_open_input fails it will automatically free
     * this context, so don't set it onto a smart pointer yet.
     */
    AVFormatContext *fmtctx{avformat_alloc_context()};
    fmtctx->pb = mIOContext.get();
    fmtctx->interrupt_callback = intcb;
    if(avformat_open_input(&fmtctx, mFilename.c_str(), nullptr, nullptr) != 0)
    {
        std::cerr<< "Failed to open "<<mFilename <<std::endl;
        return false;
    }
    mFormatCtx.reset(fmtctx);

    /* Retrieve stream information */
    if(avformat_find_stream_info(mFormatCtx.get(), nullptr) < 0)
    {
        std::cerr<< mFilename<<": failed to find stream info" <<std::endl;
        return false;
    }

    /* Dump information about file onto standard error */
    av_dump_format(mFormatCtx.get(), 0, mFilename.c_str(), 0);

    mParseThread = std::thread{std::mem_fn(&MovieState::parse_handler), this};
    return true;
}